

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode gzip_do_init(Curl_easy *data,Curl_cwriter *writer)

{
  Curl_cwriter **strm;
  int iVar1;
  char *__s1;
  
  strm = &writer[1].next;
  writer[4].cwt = (Curl_cwtype *)zalloc_cb;
  writer[4].next = (Curl_cwriter *)zfree_cb;
  __s1 = cm_zlib_zlibVersion();
  iVar1 = strcmp(__s1,"1.2.0.4");
  if (iVar1 < 0) {
    iVar1 = cm_zlib_inflateInit2_((z_streamp)strm,-0xf,"1.3.1",0x70);
    if (iVar1 != 0) goto LAB_0050c47b;
    writer[1].cwt = (Curl_cwtype *)0x800000001;
  }
  else {
    iVar1 = cm_zlib_inflateInit2_((z_streamp)strm,0x2f,"1.3.1",0x70);
    if (iVar1 != 0) {
LAB_0050c47b:
      process_zlib_error(data,(z_stream *)strm);
      return CURLE_BAD_CONTENT_ENCODING;
    }
    *(undefined4 *)&writer[1].cwt = 6;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode gzip_do_init(struct Curl_easy *data,
                                 struct Curl_cwriter *writer)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(strcmp(zlibVersion(), "1.2.0.4") >= 0) {
    /* zlib ver. >= 1.2.0.4 supports transparent gzip decompressing */
    if(inflateInit2(z, MAX_WBITS + 32) != Z_OK) {
      return process_zlib_error(data, z);
    }
    zp->zlib_init = ZLIB_INIT_GZIP; /* Transparent gzip decompress state */
  }
  else {
    /* we must parse the gzip header and trailer ourselves */
    if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
      return process_zlib_error(data, z);
    }
    zp->trailerlen = 8; /* A CRC-32 and a 32-bit input size (RFC 1952, 2.2) */
    zp->zlib_init = ZLIB_INIT; /* Initial call state */
  }

  return CURLE_OK;
}